

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuInfo.cpp
# Opt level: O1

string * __thiscall
primesieve::CpuInfo::cpuName_abi_cxx11_(string *__return_storage_ptr__,CpuInfo *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  istream *piVar5;
  long lVar6;
  iterator iVar7;
  size_type *psVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long *plVar10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string line;
  string label;
  ifstream file;
  allocator_type local_331;
  string *local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_328;
  size_type local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  string local_308;
  undefined1 *local_2e8;
  undefined8 local_2e0;
  undefined1 local_2d8;
  undefined7 uStack_2d7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c8;
  ulong local_2c0;
  string local_2b8;
  undefined8 *local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined1 local_280;
  undefined1 local_27f;
  undefined8 *local_278 [2];
  undefined8 local_268;
  long *local_258 [2];
  long local_248 [2];
  long local_238 [4];
  byte abStack_218 [488];
  
  local_330 = __return_storage_ptr__;
  std::ifstream::ifstream((istream *)local_238,"/proc/cpuinfo",_S_in);
  local_328 = &local_318;
  local_320 = 0;
  local_318._M_local_buf[0] = '\0';
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_2e8 = &local_2d8;
    local_2e0 = 0;
    local_2d8 = 0;
    paVar1 = &local_308.field_2;
    local_2c8 = &__return_storage_ptr__->field_2;
    local_2c0 = 0;
    do {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_2e8,cVar3);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
        __return_storage_ptr__ = local_330;
        if (local_2e8 != &local_2d8) {
          operator_delete(local_2e8,CONCAT71(uStack_2d7,local_2d8) + 1);
          __return_storage_ptr__ = local_330;
        }
        goto LAB_00126254;
      }
      if (((anonymous_namespace)::getCpuName(std::__cxx11::string_const&)::cpuLabels_abi_cxx11_ ==
           '\0') &&
         (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                       getCpuName(std::__cxx11::string_const&)::cpuLabels_abi_cxx11_
                                     ), iVar4 != 0)) {
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        local_2b8.field_2._M_allocated_capacity = 0x616e206c65646f6d;
        local_2b8.field_2._8_2_ = 0x656d;
        local_2b8._M_string_length = 10;
        local_2b8.field_2._M_local_buf[10] = '\0';
        local_298 = &local_288;
        local_288 = 0x6f737365636f7250;
        local_280 = 0x72;
        local_290 = 9;
        local_27f = 0;
        local_278[0] = &local_268;
        local_268._2_1_ = 0x75;
        local_268._0_2_ = 0x7063;
        local_278[1] = (undefined8 *)0x3;
        local_268._3_1_ = 0;
        __l._M_len = 3;
        __l._M_array = &local_2b8;
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(anonymous_namespace)::getCpuName(std::__cxx11::string_const&)::
                 cpuLabels_abi_cxx11_,__l,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_258,&local_331);
        lVar6 = -0x60;
        plVar10 = &local_268;
        do {
          if (plVar10 != (long *)plVar10[-2]) {
            operator_delete((long *)plVar10[-2],*plVar10 + 1);
          }
          plVar10 = plVar10 + -4;
          lVar6 = lVar6 + 0x20;
        } while (lVar6 != 0);
        __cxa_atexit(std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::~set,(anonymous_namespace)::getCpuName(std::__cxx11::string_const&)::
                            cpuLabels_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::getCpuName(std::__cxx11::string_const&)::
                             cpuLabels_abi_cxx11_);
      }
      lVar6 = std::__cxx11::string::find((char)&local_2e8,0x3a);
      local_308._M_string_length = 0;
      local_308.field_2._M_local_buf[0] = '\0';
      local_308._M_dataplus._M_p = (pointer)paVar1;
      if (lVar6 != -1) {
        std::__cxx11::string::substr((ulong)&local_2b8,(ulong)&local_2e8);
        anon_unknown.dwarf_110eda::trimString(&local_2b8);
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(anonymous_namespace)::getCpuName(std::__cxx11::string_const&)::
                          cpuLabels_abi_cxx11_,&local_2b8);
        if (iVar7._M_node !=
            (_Base_ptr)
            ((anonymous_namespace)::getCpuName(std::__cxx11::string_const&)::cpuLabels_abi_cxx11_ +
            8)) {
          std::__cxx11::string::substr((ulong)local_258,(ulong)&local_2e8);
          std::__cxx11::string::operator=((string *)&local_308,(string *)local_258);
          if (local_258[0] != local_248) {
            operator_delete(local_258[0],local_248[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
      }
      anon_unknown.dwarf_110eda::trimString(&local_308);
      if ((local_308._M_string_length == 0) ||
         (lVar6 = std::__cxx11::string::find_first_not_of((char *)&local_308,0x131144,0),
         lVar6 == -1)) {
        local_2c0 = local_2c0 + 1;
        bVar2 = true;
        if (10 < local_2c0) {
          (local_330->_M_dataplus)._M_p = (pointer)local_2c8;
          paVar9 = &local_318;
          if (local_328 == paVar9) {
            local_2c8->_M_allocated_capacity =
                 CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]);
            *(undefined8 *)((long)local_2c8 + 8) = local_318._8_8_;
          }
          else {
            (local_330->_M_dataplus)._M_p = (pointer)local_328;
            (local_330->field_2)._M_allocated_capacity =
                 CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]);
          }
          local_330->_M_string_length = local_320;
          psVar8 = &local_320;
          local_328 = paVar9;
          goto LAB_001260d8;
        }
      }
      else {
        (local_330->_M_dataplus)._M_p = (pointer)local_2c8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p == paVar1) {
          local_2c8->_M_allocated_capacity =
               CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,
                        local_308.field_2._M_local_buf[0]);
          *(undefined8 *)((long)local_2c8 + 8) = local_308.field_2._8_8_;
        }
        else {
          (local_330->_M_dataplus)._M_p = local_308._M_dataplus._M_p;
          (local_330->field_2)._M_allocated_capacity =
               CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,
                        local_308.field_2._M_local_buf[0]);
        }
        local_330->_M_string_length = local_308._M_string_length;
        psVar8 = &local_308._M_string_length;
        paVar9 = paVar1;
        local_308._M_dataplus._M_p = (pointer)paVar1;
LAB_001260d8:
        *psVar8 = 0;
        paVar9->_M_local_buf[0] = '\0';
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != paVar1) {
        operator_delete(local_308._M_dataplus._M_p,
                        CONCAT71(local_308.field_2._M_allocated_capacity._1_7_,
                                 local_308.field_2._M_local_buf[0]) + 1);
      }
    } while (bVar2);
    __return_storage_ptr__ = local_330;
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8,CONCAT71(uStack_2d7,local_2d8) + 1);
      __return_storage_ptr__ = local_330;
    }
  }
  else {
LAB_00126254:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_328 == &local_318) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_318._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_328;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_320;
    local_320 = 0;
    local_318._M_local_buf[0] = '\0';
    local_328 = &local_318;
  }
  if (local_328 != &local_318) {
    operator_delete(local_328,
                    CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

string CpuInfo::cpuName() const
{
  try
  {
    // On Linux we get the CPU name by parsing /proc/cpuinfo
    // which can be quite slow on PCs without fast SSD.
    // For this reason we don't initialize the CPU name at
    // startup but instead we lazy load it when needed.
    return getCpuName();
  }
  catch (exception&)
  {
    return {};
  }
}